

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O3

void avro::
     codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen::Nested>_>_>_>
     ::encode(Encoder *e,
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen::Nested,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testgen::Nested>_>_>
             *b)

{
  _Rb_tree_node_base *p_Var1;
  
  (**(code **)(*(long *)e + 0x80))();
  if ((b->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    (**(code **)(*(long *)e + 0x90))(e);
    for (p_Var1 = (b->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(b->_M_t)._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      (**(code **)(*(long *)e + 0x98))(e);
      (**(code **)(*(long *)e + 0x50))(e,p_Var1 + 1);
      (**(code **)(*(long *)e + 0x48))(*(undefined8 *)(p_Var1 + 2),e);
      (**(code **)(*(long *)e + 0x50))(e,&p_Var1[2]._M_parent);
      (**(code **)(*(long *)e + 0x30))(e,*(undefined4 *)&p_Var1[3]._M_parent);
    }
  }
  (**(code **)(*(long *)e + 0x88))(e);
  return;
}

Assistant:

static void encode(Encoder& e, const std::map<std::string, T>& b) {
        e.mapStart();
        if (! b.empty()) {
            e.setItemCount(b.size());
            for (typename std::map<std::string, T>::const_iterator
                it = b.begin();
                it != b.end(); ++it) {
                e.startItem();
                avro::encode(e, it->first);
                avro::encode(e, it->second);
            }
        }
        e.mapEnd();
    }